

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O0

double mp::ComputeValue<mp::VarInfoRecomp>(NumberofVarConstraint *con,VarInfoRecomp *x)

{
  bool bVar1;
  Arguments *this;
  VarInfoImpl<mp::VarVecRecomp> *in_RSI;
  long in_RDI;
  double dVar2;
  double dVar3;
  value_type v;
  size_type i;
  double k;
  Arguments *args;
  double result;
  double in_stack_ffffffffffffffb8;
  int i_00;
  VarInfoImpl<mp::VarVecRecomp> *this_00;
  size_type local_30;
  double local_18;
  
  local_18 = 0.0;
  this = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumberofVarId>
         ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumberofVarId>
                         *)(in_RDI + 0x28));
  this_00 = in_RSI;
  std::vector<int,_std::allocator<int>_>::operator[](this,0);
  dVar2 = VarInfoImpl<mp::VarVecRecomp>::operator[]
                    (this_00,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  local_30 = std::vector<int,_std::allocator<int>_>::size(this);
LAB_002af493:
  local_30 = local_30 - 1;
  if (local_30 == 0) {
    return local_18;
  }
  std::vector<int,_std::allocator<int>_>::operator[](this,local_30);
  i_00 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  bVar1 = VarInfoImpl<mp::VarVecRecomp>::is_var_int(this_00,i_00);
  if (!bVar1) goto LAB_002af4f3;
  dVar3 = VarInfoImpl<mp::VarVecRecomp>::operator[](this_00,i_00);
  dVar3 = round(dVar3);
  if ((dVar3 != dVar2) || (NAN(dVar3) || NAN(dVar2))) goto LAB_002af4f3;
  goto LAB_002af52c;
LAB_002af4f3:
  dVar3 = VarInfoImpl<mp::VarVecRecomp>::operator[](this_00,i_00);
  in_stack_ffffffffffffffb8 = ABS(dVar3 - dVar2);
  dVar3 = VarInfoImpl<mp::VarVecRecomp>::feastol(in_RSI);
  if (in_stack_ffffffffffffffb8 <= dVar3) {
LAB_002af52c:
    local_18 = local_18 + 1.0;
  }
  goto LAB_002af493;
}

Assistant:

double ComputeValue(const NumberofVarConstraint& con, const VarVec& x) {
  double result = 0.0;
  const auto& args = con.GetArguments();
  auto k = x[args[0]];
  for (auto i=args.size(); --i; ) {
    auto v = args[i];
    if ((x.is_var_int(v)
         && std::round(x[v]) == k)
        || std::fabs(x[v] - k) <= x.feastol())
      ++result;
  }
  return result;
}